

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<ThreadContext::CollectCallBack,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<ThreadContext::CollectCallBack,_RealCount> *this,HeapAllocator *allocator,
          CollectCallBack *element)

{
  DListNodeBase<ThreadContext::CollectCallBack> *pDVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<ThreadContext::CollectCallBack> *pDVar4;
  undefined4 *puVar5;
  DListNode<ThreadContext::CollectCallBack> *buffer;
  
  buffer = (DListNode<ThreadContext::CollectCallBack> *)(element + -1);
  pDVar4 = (DListNode<ThreadContext::CollectCallBack> *)this;
  do {
    pDVar4 = (pDVar4->super_DListNodeBase<ThreadContext::CollectCallBack>).next.node;
    if (pDVar4 == (DListNode<ThreadContext::CollectCallBack> *)this) break;
  } while (pDVar4 != buffer);
  if (pDVar4 == (DListNode<ThreadContext::CollectCallBack> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pDVar1 = (buffer->super_DListNodeBase<ThreadContext::CollectCallBack>).next.base;
  *(DListNodeBase<ThreadContext::CollectCallBack> **)element[-1].context = pDVar1;
  pDVar1->prev = (anon_union_8_3_7fb8a913_for_prev)element[-1].context;
  Memory::HeapAllocator::Free(allocator,buffer,0x20);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }